

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_10.hpp
# Opt level: O0

type * boost::phoenix::
       expr_ext<boost::phoenix::actor,_boost::phoenix::detail::tag::function_eval,_boost::spirit::terminal<boost::spirit::tag::eps>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::less,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::size>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>_>,_2L>_>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
       ::make(type *__return_storage_ptr__,param_type a0,param_type a1)

{
  param_type a1_local;
  param_type a0_local;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::less,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::size>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>_>,_2L>_>_>,_2L>_>
  *e;
  undefined1 local_80 [8];
  expr_type that;
  
  that.child1.proto_expr_._16_8_ = a1;
  spirit::terminal<boost::spirit::tag::eps>::terminal
            ((terminal<boost::spirit::tag::eps> *)local_80,a0);
  that._0_8_ = *(undefined8 *)that.child1.proto_expr_._16_8_;
  that.child1.proto_expr_.child0.proto_expr_._0_8_ =
       *(undefined8 *)(that.child1.proto_expr_._16_8_ + 8);
  that.child1.proto_expr_.child0.proto_expr_.child1.proto_expr_.child0.t_ =
       (expr_type)((proto_child0 *)(that.child1.proto_expr_._16_8_ + 0x10))->t_;
  proto::exprns_::
  basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::less,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::size>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>_>,_2L>_>_>,_2L>
  ::basic_expr(&__return_storage_ptr__->proto_expr_,
               (basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::less,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::size>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>_>,_2L>_>_>,_2L>
                *)local_80);
  return __return_storage_ptr__;
}

Assistant:

static type make(typename call_traits<A0>::param_type a0 , typename call_traits<A1>::param_type a1)
      { 
        
                actor<base_type> const e =
                {
                    proto::make_expr<
                        Tag
                      , phoenix_default_domain 
                    >(a0 , a1)
                };
            return e;
        }